

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

int motion_field_projection(AV1_COMMON *cm,MV_REFERENCE_FRAME start_frame,int dir)

{
  int16_t iVar1;
  int16_t iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  uint num;
  uint uVar9;
  RefCntBuffer *pRVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int blk_col;
  ulong uVar15;
  MV ref;
  int iVar16;
  ulong uVar17;
  MV_REFERENCE_FRAME *pMVar18;
  long lVar19;
  ulong uVar20;
  OrderHintInfo *oh;
  int local_9c;
  int_mv this_mv;
  long local_70;
  TPL_MV_REF *local_68;
  int base_blk_row;
  int ref_offset [8];
  
  local_68 = cm->tpl_mvs;
  ref_offset[4] = 0;
  ref_offset[5] = 0;
  ref_offset[6] = 0;
  ref_offset[7] = 0;
  ref_offset[0] = 0;
  ref_offset[1] = 0;
  ref_offset[2] = 0;
  ref_offset[3] = 0;
  pRVar10 = get_ref_frame_buf(cm,start_frame);
  local_9c = 0;
  if ((((pRVar10 != (RefCntBuffer *)0x0) && ((pRVar10->frame_type & 0xfd) != 0)) &&
      (iVar16 = pRVar10->mi_rows, iVar16 == (cm->mi_params).mi_rows)) &&
     (iVar3 = pRVar10->mi_cols, iVar3 == (cm->mi_params).mi_cols)) {
    uVar12 = pRVar10->order_hint;
    oh = &cm->seq_params->order_hint_info;
    uVar7 = get_relative_dist(oh,uVar12,cm->cur_frame->order_hint);
    for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
      iVar8 = get_relative_dist(oh,uVar12,pRVar10->ref_order_hints[lVar19]);
      ref_offset[lVar19 + 1] = iVar8;
    }
    uVar12 = uVar7;
    if ((int)uVar7 < 1) {
      uVar12 = -uVar7;
    }
    num = -uVar7;
    if (dir != 2) {
      num = uVar7;
    }
    uVar7 = iVar16 + 1 >> 1;
    uVar14 = iVar3 + 1 >> 1;
    uVar17 = 0;
    uVar20 = 0;
    if (0 < (int)uVar14) {
      uVar20 = (ulong)uVar14;
    }
    uVar11 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar11 = uVar17;
    }
    pMVar18 = &pRVar10->mvs->ref_frame;
    local_70 = (long)(int)uVar14 << 3;
    local_9c = 1;
    for (; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      uVar7 = (uint)uVar17;
      _base_blk_row = (ulong)(uVar7 & 0x7ffffff8);
      for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
        if (((0 < (long)pMVar18[uVar15 * 8]) &&
            (uVar14 = ref_offset[pMVar18[uVar15 * 8]], 0 < (int)uVar14)) &&
           ((uVar14 < 0x20 && (uVar12 < 0x20)))) {
          iVar1 = *(int16_t *)(pMVar18 + uVar15 * 8 + -4);
          iVar2 = *(int16_t *)(pMVar18 + uVar15 * 8 + -2);
          ref.col = iVar2;
          ref.row = iVar1;
          get_mv_projection(&this_mv.as_mv,ref,num,uVar14);
          sVar6 = this_mv.as_mv.row;
          uVar4 = -((uint)-(int)sVar6 >> 6);
          if (-1 < sVar6) {
            uVar4 = (uint)(int)sVar6 >> 6;
          }
          uVar9 = (int)this_mv.as_int >> 0x10;
          uVar13 = -(-uVar9 >> 6);
          if (-1 < (int)uVar9) {
            uVar13 = uVar9 >> 6;
          }
          uVar9 = -uVar13;
          uVar5 = -uVar4;
          if ((dir & 0xfffffffeU) != 2) {
            uVar9 = uVar13;
            uVar5 = uVar4;
          }
          iVar16 = uVar5 + uVar7;
          if ((-1 < iVar16) && (iVar16 < (cm->mi_params).mi_rows >> 1)) {
            uVar4 = (uint)uVar15;
            uVar13 = uVar9 + uVar4;
            if ((-1 < (int)uVar13) &&
               (((((int)uVar13 < (cm->mi_params).mi_cols >> 1 && (base_blk_row <= iVar16)) &&
                 (iVar16 < (int)((uVar7 & 0x7ffffff8) + 8))) &&
                (((int)((uVar4 & 0x7ffffff8) - 8) <= (int)uVar13 &&
                 (uVar13 < (uVar4 & 0x7ffffff8) + 0x10)))))) {
              iVar16 = uVar9 + uVar4 + (uVar5 + uVar7) * ((cm->mi_params).mi_stride >> 1);
              local_68[iVar16].mfmv0.as_mv.row = iVar1;
              local_68[iVar16].mfmv0.as_mv.col = iVar2;
              local_68[iVar16].ref_frame_offset = (uint8_t)uVar14;
            }
          }
        }
      }
      pMVar18 = pMVar18 + local_70;
    }
  }
  return local_9c;
}

Assistant:

static int motion_field_projection(AV1_COMMON *cm,
                                   MV_REFERENCE_FRAME start_frame, int dir) {
  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int ref_offset[REF_FRAMES] = { 0 };

  const RefCntBuffer *const start_frame_buf =
      get_ref_frame_buf(cm, start_frame);
  if (start_frame_buf == NULL) return 0;

  if (start_frame_buf->frame_type == KEY_FRAME ||
      start_frame_buf->frame_type == INTRA_ONLY_FRAME)
    return 0;

  if (start_frame_buf->mi_rows != cm->mi_params.mi_rows ||
      start_frame_buf->mi_cols != cm->mi_params.mi_cols)
    return 0;

  const int start_frame_order_hint = start_frame_buf->order_hint;
  const unsigned int *const ref_order_hints =
      &start_frame_buf->ref_order_hints[0];
  const int cur_order_hint = cm->cur_frame->order_hint;
  int start_to_current_frame_offset = get_relative_dist(
      &cm->seq_params->order_hint_info, start_frame_order_hint, cur_order_hint);

  for (MV_REFERENCE_FRAME rf = LAST_FRAME; rf <= INTER_REFS_PER_FRAME; ++rf) {
    ref_offset[rf] = get_relative_dist(&cm->seq_params->order_hint_info,
                                       start_frame_order_hint,
                                       ref_order_hints[rf - LAST_FRAME]);
  }

  if (dir == 2) start_to_current_frame_offset = -start_to_current_frame_offset;

  MV_REF *mv_ref_base = start_frame_buf->mvs;
  const int mvs_rows = (cm->mi_params.mi_rows + 1) >> 1;
  const int mvs_cols = (cm->mi_params.mi_cols + 1) >> 1;

  for (int blk_row = 0; blk_row < mvs_rows; ++blk_row) {
    for (int blk_col = 0; blk_col < mvs_cols; ++blk_col) {
      MV_REF *mv_ref = &mv_ref_base[blk_row * mvs_cols + blk_col];
      MV fwd_mv = mv_ref->mv.as_mv;

      if (mv_ref->ref_frame > INTRA_FRAME) {
        int_mv this_mv;
        int mi_r, mi_c;
        const int ref_frame_offset = ref_offset[mv_ref->ref_frame];

        int pos_valid =
            abs(ref_frame_offset) <= MAX_FRAME_DISTANCE &&
            ref_frame_offset > 0 &&
            abs(start_to_current_frame_offset) <= MAX_FRAME_DISTANCE;

        if (pos_valid) {
          get_mv_projection(&this_mv.as_mv, fwd_mv,
                            start_to_current_frame_offset, ref_frame_offset);
          pos_valid = get_block_position(cm, &mi_r, &mi_c, blk_row, blk_col,
                                         this_mv.as_mv, dir >> 1);
        }

        if (pos_valid) {
          const int mi_offset = mi_r * (cm->mi_params.mi_stride >> 1) + mi_c;

          tpl_mvs_base[mi_offset].mfmv0.as_mv.row = fwd_mv.row;
          tpl_mvs_base[mi_offset].mfmv0.as_mv.col = fwd_mv.col;
          tpl_mvs_base[mi_offset].ref_frame_offset = ref_frame_offset;
        }
      }
    }
  }

  return 1;
}